

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

int Io_ReadBlifNetworkConnectBoxesOneBox(Io_ReadBlif_t *p,Abc_Obj_t *pBox,stmm_table *tName2Model)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  int iVar9;
  char *__format;
  bool bVar10;
  Abc_Ntk_t *pNtkModel;
  Io_ReadBlif_t *local_40;
  Abc_Obj_t *local_38;
  
  pVVar1 = *(Vec_Ptr_t **)&(pBox->field_5).iData;
  iVar9 = 0;
  pcVar4 = (char *)Vec_PtrEntry(pVVar1,0);
  iVar2 = stmm_lookup(tName2Model,pcVar4,(char **)&pNtkModel);
  if (iVar2 != 0) {
    iVar2 = 1;
    local_40 = p;
    local_38 = pBox;
    for (; iVar3 = pNtkModel->vPis->nSize, iVar9 < iVar3; iVar9 = iVar9 + 1) {
      pAVar5 = Abc_NtkPi(pNtkModel,iVar9);
      (pAVar5->field_6).pTemp = (void *)0x0;
    }
    iVar9 = 0;
    if (iVar3 == 0) {
      pcVar4 = (char *)0x0;
      pAVar5 = local_38;
    }
    else {
      pcVar4 = (char *)0x0;
      iVar3 = 1;
      do {
        if (pVVar1->nSize <= iVar3) {
          iVar2 = -1;
          pAVar5 = local_38;
          break;
        }
        pcVar4 = (char *)Vec_PtrEntry(pVVar1,iVar3);
        pcVar6 = Io_ReadBlifCleanName(pcVar4);
        if (pcVar6 == (char *)0x0) {
          iVar2 = (local_38->field_6).iTemp;
          goto LAB_002da712;
        }
        iVar2 = ~(uint)pcVar4 + (int)pcVar6;
        pcVar4[iVar2] = '\0';
        pAVar5 = Abc_NtkFindNet(pNtkModel,pcVar4);
        p = local_40;
        if (pAVar5 == (Abc_Obj_t *)0x0) {
          local_40->LineCur = (local_38->field_6).iTemp;
          pvVar8 = Vec_PtrEntry(pVVar1,0);
          pcVar6 = "Cannot find formal input \"%s\" as an PI of model \"%s\".";
          goto LAB_002da80e;
        }
        pvVar8 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
        pAVar5 = local_38;
        if ((*(uint *)((long)pvVar8 + 0x14) & 0xf) != 2) {
          pcVar4[iVar2] = '=';
          iVar2 = iVar3;
          break;
        }
        if (*(long *)((long)pvVar8 + 0x40) != 0) {
          local_40->LineCur = (local_38->field_6).iTemp;
          pcVar6 = local_40->sError;
          __format = "Formal input \"%s\" is used more than once.";
          goto LAB_002da781;
        }
        *(char **)((long)pvVar8 + 0x40) = pcVar6;
        iVar2 = iVar3 + 1;
        bVar10 = iVar3 != pNtkModel->vPis->nSize;
        iVar3 = iVar2;
      } while (bVar10);
    }
    do {
      iVar3 = pNtkModel->vPis->nSize;
      if (iVar3 <= iVar9) goto LAB_002da5c7;
      pAVar7 = Abc_NtkPi(pNtkModel,iVar9);
      p = local_40;
      if ((char *)(pAVar7->field_6).pTemp == (char *)0x0) {
        local_40->LineCur = (pAVar5->field_6).iTemp;
        pvVar8 = Vec_PtrEntry(pVVar1,0);
        pcVar6 = "Formal input \"%s\" of model %s is not driven.";
        goto LAB_002da74f;
      }
      pAVar7 = Abc_NtkFindOrCreateNet(pAVar5->pNtk,(char *)(pAVar7->field_6).pTemp);
      Abc_ObjAddFanin(pAVar5,pAVar7);
      iVar9 = iVar9 + 1;
    } while( true );
  }
  p->LineCur = (pBox->field_6).iTemp;
  pvVar8 = Vec_PtrEntry(pVVar1,0);
  sprintf(p->sError,"Cannot find the model for subcircuit %s.",pvVar8);
  goto LAB_002da821;
LAB_002da5c7:
  for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
    pAVar7 = Abc_NtkPi(pNtkModel,iVar9);
    (pAVar7->field_6).pTemp = (void *)0x0;
    iVar3 = pNtkModel->vPis->nSize;
  }
  for (iVar9 = 0; iVar9 < pNtkModel->vPos->nSize; iVar9 = iVar9 + 1) {
    pAVar7 = Abc_NtkPo(pNtkModel,iVar9);
    (pAVar7->field_6).pTemp = (void *)0x0;
  }
  for (; pAVar7 = local_38, p = local_40, iVar2 < pVVar1->nSize; iVar2 = iVar2 + 1) {
    pcVar4 = (char *)Vec_PtrEntry(pVVar1,iVar2);
    pcVar6 = Io_ReadBlifCleanName(pcVar4);
    if (pcVar6 == (char *)0x0) {
      iVar2 = (pAVar5->field_6).iTemp;
LAB_002da712:
      local_40->LineCur = iVar2;
      pcVar6 = local_40->sError;
      __format = "Cannot parse formal/actual name pair \"%s\".";
LAB_002da781:
      p = local_40;
      sprintf(pcVar6,__format,pcVar4);
      goto LAB_002da821;
    }
    pcVar4[(int)(~(uint)pcVar4 + (int)pcVar6)] = '\0';
    pAVar7 = Abc_NtkFindNet(pNtkModel,pcVar4);
    p = local_40;
    if (pAVar7 == (Abc_Obj_t *)0x0) {
      local_40->LineCur = (pAVar5->field_6).iTemp;
      pvVar8 = Vec_PtrEntry(pVVar1,0);
      pcVar6 = "Cannot find formal output \"%s\" as an PO of model \"%s\".";
LAB_002da74f:
      sprintf(p->sError,pcVar6,pcVar4,pvVar8);
      goto LAB_002da821;
    }
    pvVar8 = pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray];
    if (*(long *)((long)pvVar8 + 0x40) != 0) {
      local_40->LineCur = (pAVar5->field_6).iTemp;
      pcVar6 = local_40->sError;
      __format = "Formal output \"%s\" is used more than once.";
      goto LAB_002da781;
    }
    *(char **)((long)pvVar8 + 0x40) = pcVar6;
  }
  iVar2 = 0;
  while( true ) {
    pAVar5 = local_38;
    iVar9 = pNtkModel->vPos->nSize;
    if (iVar9 <= iVar2) {
      for (iVar2 = 0; iVar2 < iVar9; iVar2 = iVar2 + 1) {
        pAVar7 = Abc_NtkPo(pNtkModel,iVar2);
        (pAVar7->field_6).pTemp = (void *)0x0;
        iVar9 = pNtkModel->vPos->nSize;
      }
      for (iVar2 = 0; pVVar1 = (Vec_Ptr_t *)(pAVar5->field_5).pData, iVar2 < pVVar1->nSize;
          iVar2 = iVar2 + 1) {
        pvVar8 = Vec_PtrEntry(pVVar1,iVar2);
        free(pvVar8);
      }
      Vec_PtrFree(pVVar1);
      (pAVar5->field_5).pData = pNtkModel;
      return 0;
    }
    pAVar5 = Abc_NtkPo(pNtkModel,iVar2);
    if ((char *)(pAVar5->field_6).pTemp == (char *)0x0) break;
    pAVar5 = Abc_NtkFindOrCreateNet(pAVar7->pNtk,(char *)(pAVar5->field_6).pTemp);
    Abc_ObjAddFanin(pAVar5,pAVar7);
    iVar2 = iVar2 + 1;
  }
  p->LineCur = (local_38->field_6).iTemp;
  pvVar8 = Vec_PtrEntry(pVVar1,0);
  pcVar6 = "Formal output \"%s\" of model %s is not driven.";
LAB_002da80e:
  sprintf(p->sError,pcVar6,pcVar4,pvVar8);
LAB_002da821:
  Io_ReadBlifPrintErrorMessage(p);
  return 1;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOneBox( Io_ReadBlif_t * p, Abc_Obj_t * pBox, stmm_table * tName2Model )
{
    Vec_Ptr_t * pNames;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pNet;
    char * pName = NULL, * pActual;
    int i, Length, Start = -1;

    // get the model for this box
    pNames = (Vec_Ptr_t *)pBox->pData;
    if ( !stmm_lookup( tName2Model, (char *)Vec_PtrEntry(pNames, 0), (char **)&pNtkModel ) )
    {
        p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
        sprintf( p->sError, "Cannot find the model for subcircuit %s.", (char*)Vec_PtrEntry(pNames, 0) );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }

    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    if ( Abc_NtkPiNum(pNtkModel) == 0 )
        Start = 1;
    else
    {
        Vec_PtrForEachEntryStart( char *, pNames, pName, i, 1 )
        {
            pActual = Io_ReadBlifCleanName(pName);
            if ( pActual == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            Length = pActual - pName - 1;
            pName[Length] = 0;
            // find the PI net with this name
            pObj = Abc_NtkFindNet( pNtkModel, pName );
            if ( pObj == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot find formal input \"%s\" as an PI of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            // get the PI
            pObj = Abc_ObjFanin0(pObj);
            // quit if this is not a PI net
            if ( !Abc_ObjIsPi(pObj) )
            {
                pName[Length] = '=';
                Start = i;
                break;
            }
            // remember the actual name in the net
            if ( pObj->pCopy != NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Formal input \"%s\" is used more than once.", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            pObj->pCopy = (Abc_Obj_t *)pActual;
            // quit if we processed all PIs
            if ( i == Abc_NtkPiNum(pNtkModel) )
            {
                Start = i+1;
                break;
            }
        }
    }
    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal input \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pBox, pNet );
    }
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntryStart( char *, pNames, pName, i, Start )
    {
        pActual = Io_ReadBlifCleanName(pName);
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        Length = pActual - pName - 1;
        pName[Length] = 0;
        // find the PO net with this name
        pObj = Abc_NtkFindNet( pNtkModel, pName );
        if ( pObj == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot find formal output \"%s\" as an PO of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        // get the PO
        pObj = Abc_ObjFanout0(pObj);
        if ( pObj->pCopy != NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" is used more than once.", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pObj->pCopy = (Abc_Obj_t *)pActual;
    }
    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pNet, pBox );
    }
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // remove the array of names, assign the pointer to the model
    Vec_PtrForEachEntry( char *, (Vec_Ptr_t *)pBox->pData, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( (Vec_Ptr_t *)pBox->pData );
    pBox->pData = pNtkModel;
    return 0;
}